

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintLevel(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pNode_00;
  char *pcVar2;
  uint local_48;
  uint local_44;
  int fVerbose;
  int fProfile;
  int fListNodes;
  int c;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  local_44 = 1;
  local_48 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"npvh"), iVar1 != -1) {
    switch(iVar1) {
    case 0x68:
      goto LAB_0026228f;
    default:
      goto LAB_0026228f;
    case 0x6e:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x70:
      local_44 = local_44 ^ 1;
      break;
    case 0x76:
      local_48 = local_48 ^ 1;
    }
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else if ((local_44 == 0) && (iVar1 = Abc_NtkIsStrash(pNtk_00), iVar1 == 0)) {
    Abc_Print(-1,"This command works only for AIGs (run \"strash\").\n");
    pAbc_local._4_4_ = 1;
  }
  else if (globalUtilOptind + 1 < argc) {
    Abc_Print(-1,"Wrong number of auguments.\n");
LAB_0026228f:
    Abc_Print(-2,"usage: print_level [-npvh] <node>\n");
    Abc_Print(-2,"\t        prints information about node level and cone size\n");
    pcVar2 = "no";
    if (fVerbose != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-n    : toggles printing nodes by levels [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_44 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-p    : toggles printing level profile [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_48 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar2);
    Abc_Print(-2,"\t-h    : print the command usage\n");
    Abc_Print(-2,"\tnode  : (optional) one node to consider\n");
    pAbc_local._4_4_ = 1;
  }
  else if (argc == globalUtilOptind + 1) {
    pNode_00 = Abc_NtkFindNode(pNtk_00,argv[globalUtilOptind]);
    if (pNode_00 == (Abc_Obj_t *)0x0) {
      Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_NodePrintLevel(_stdout,pNode_00);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_NtkPrintLevel(_stdout,pNtk_00,local_44,fVerbose,local_48);
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandPrintLevel( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int fListNodes;
    int fProfile;
    int fVerbose;

    // set defaults
    fListNodes = 0;
    fProfile   = 1;
    fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "npvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fListNodes ^= 1;
            break;
        case 'p':
            fProfile ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !fProfile && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
        Abc_NodePrintLevel( stdout, pNode );
        return 0;
    }
    // process all COs
    Abc_NtkPrintLevel( stdout, pNtk, fProfile, fListNodes, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: print_level [-npvh] <node>\n" );
    Abc_Print( -2, "\t        prints information about node level and cone size\n" );
    Abc_Print( -2, "\t-n    : toggles printing nodes by levels [default = %s]\n", fListNodes? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggles printing level profile [default = %s]\n", fProfile? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tnode  : (optional) one node to consider\n");
    return 1;
}